

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::printFloat(ostringstream *oss,double d)

{
  long lVar1;
  
  lVar1 = *(long *)oss;
  *(uint *)(oss + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(oss + *(long *)(lVar1 + -0x18) + 0x18) | 0x14;
  *(undefined8 *)(oss + *(long *)(lVar1 + -0x18) + 8) = 4;
  *(undefined8 *)(oss + *(long *)(lVar1 + -0x18) + 0x10) = 7;
  std::ostream::_M_insert<double>(d);
  return;
}

Assistant:

void printFloat (ostringstream& oss, double d)
{
	oss.setf(oss.fixed | oss.internal);
	oss.precision(4);
	oss.width(7);
	oss << d;
}